

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::Combo(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter,
                 void *data,int items_count,int popup_max_height_in_items)

{
  int iVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  void *pvVar5;
  void *ptr_id;
  float fVar6;
  char *item_text;
  char *preview_text;
  void *local_50;
  char *local_48;
  char *local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  local_40 = (char *)0x0;
  iVar1 = *current_item;
  if (iVar1 < items_count && -1 < iVar1) {
    (*items_getter)(data,iVar1,&local_40);
  }
  if ((popup_max_height_in_items != -1) && ((pIVar3->NextWindowData).SizeConstraintCond == 0)) {
    fVar6 = CalcMaxPopupHeightFromItemCount(popup_max_height_in_items);
    pIVar3 = GImGui;
    (GImGui->NextWindowData).SizeConstraintCond = 1;
    (pIVar3->NextWindowData).SizeConstraintRect.Min.x = 0.0;
    (pIVar3->NextWindowData).SizeConstraintRect.Min.y = 0.0;
    (pIVar3->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar3->NextWindowData).SizeConstraintRect.Max.y = fVar6;
    (pIVar3->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar3->NextWindowData).SizeCallbackUserData = (void *)0x0;
  }
  bVar4 = BeginCombo(label,local_40,0);
  local_50 = (void *)0x0;
  if (bVar4) {
    local_50 = (void *)0x0;
    pvVar5 = (void *)(ulong)(uint)items_count;
    if (items_count < 1) {
      pvVar5 = (void *)0x0;
    }
    for (ptr_id = (void *)0x0; pvVar5 != ptr_id; ptr_id = (void *)((long)ptr_id + 1)) {
      PushID(ptr_id);
      uVar2 = *current_item;
      bVar4 = (*items_getter)(data,(int)ptr_id,&local_48);
      if (!bVar4) {
        local_48 = "*Unknown item*";
      }
      local_38.x = 0.0;
      local_38.y = 0.0;
      bVar4 = Selectable(local_48,ptr_id == (void *)(ulong)uVar2,0,&local_38);
      if (bVar4) {
        *current_item = (int)ptr_id;
        local_50 = (void *)0x1;
      }
      if (ptr_id == (void *)(ulong)uVar2) {
        SetItemDefaultFocus();
      }
      PopID();
    }
    EndCombo();
  }
  return SUB81(local_50,0);
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int popup_max_height_in_items)
{
    ImGuiContext& g = *GImGui;

    const char* preview_text = NULL;
    if (*current_item >= 0 && *current_item < items_count)
        items_getter(data, *current_item, &preview_text);

    // The old Combo() API exposed "popup_max_height_in_items", however the new more general BeginCombo() API doesn't, so we emulate it here.
    if (popup_max_height_in_items != -1 && !g.NextWindowData.SizeConstraintCond)
    {
        float popup_max_height = CalcMaxPopupHeightFromItemCount(popup_max_height_in_items);
        SetNextWindowSizeConstraints(ImVec2(0,0), ImVec2(FLT_MAX, popup_max_height));
    }

    if (!BeginCombo(label, preview_text, 0))
        return false;

    // Display items
    // FIXME-OPT: Use clipper (but we need to disable it on the appearing frame to make sure our call to SetItemDefaultFocus() is processed)
    bool value_changed = false;
    for (int i = 0; i < items_count; i++)
    {
        PushID((void*)(intptr_t)i);
        const bool item_selected = (i == *current_item);
        const char* item_text;
        if (!items_getter(data, i, &item_text))
            item_text = "*Unknown item*";
        if (Selectable(item_text, item_selected))
        {
            value_changed = true;
            *current_item = i;
        }
        if (item_selected)
            SetItemDefaultFocus();
        PopID();
    }

    EndCombo();
    return value_changed;
}